

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

Vec_Wec_t * Gia_ManFindCofs(Gia_Man_t *p,Vec_Int_t *vRes,Gia_Man_t **ppNew)

{
  byte bVar1;
  uint uVar2;
  int iLit1;
  Vec_Wec_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar3;
  Gia_Obj_t *pGVar4;
  Vec_Int_t *p_02;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  
  iVar5 = 1 << ((byte)vRes->nSize & 0x1f);
  p_00 = Vec_WecAlloc(iVar5);
  p_00->nSize = iVar5;
  bVar1 = (byte)vRes->nSize & 0x1f;
  uVar8 = 1 << bVar1;
  p_01 = Gia_ManStart(p->nObjs);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_01->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_01->pSpec = pcVar3;
  Gia_ManSetRegNum(p_01,p->nRegs);
  Gia_ManHashAlloc(p_01);
  Gia_ManFillValue(p);
  p->pObjs->Value = 0;
  iVar5 = p->vCis->nSize;
  if (iVar5 <= vRes->nSize) {
    __assert_fail("Vec_IntSize(vRes) < Gia_ManCiNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                  ,0x40f,"Vec_Wec_t *Gia_ManFindCofs(Gia_Man_t *, Vec_Int_t *, Gia_Man_t **)");
  }
  iVar6 = 0;
  while ((iVar6 < iVar5 && (pGVar4 = Gia_ManCi(p,iVar6), pGVar4 != (Gia_Obj_t *)0x0))) {
    uVar2 = Gia_ManAppendCi(p_01);
    pGVar4->Value = uVar2;
    iVar6 = iVar6 + 1;
    iVar5 = p->vCis->nSize;
  }
  uVar2 = 0;
  if (1 << bVar1 < 1) {
    uVar8 = 0;
  }
  do {
    if (uVar2 == uVar8) {
      if (ppNew != (Gia_Man_t **)0x0) {
        *ppNew = p_01;
      }
      return p_00;
    }
    p_02 = Vec_WecEntry(p_00,uVar2);
    for (uVar7 = 0; (int)uVar7 < vRes->nSize; uVar7 = uVar7 + 1) {
      iVar5 = Vec_IntEntry(vRes,uVar7);
      pGVar4 = Gia_ManCi(p,iVar5);
      pGVar4->Value = (uint)((uVar2 >> (uVar7 & 0x1f) & 1) != 0);
    }
    iVar5 = 0;
    while ((iVar5 < p->nObjs && (pGVar4 = Gia_ManObj(p,iVar5), pGVar4 != (Gia_Obj_t *)0x0))) {
      if ((~*(uint *)pGVar4 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar4) {
        iVar6 = Gia_ObjFanin0Copy(pGVar4);
        iLit1 = Gia_ObjFanin1Copy(pGVar4);
        uVar7 = Gia_ManHashAnd(p_01,iVar6,iLit1);
        pGVar4->Value = uVar7;
      }
      iVar5 = iVar5 + 1;
    }
    for (iVar5 = 0; iVar6 = p->vCos->nSize, iVar5 < iVar6; iVar5 = iVar5 + 1) {
      pGVar4 = Gia_ManCo(p,iVar5);
      if (pGVar4 == (Gia_Obj_t *)0x0) {
        iVar6 = p->vCos->nSize;
        break;
      }
      iVar6 = Gia_ObjFanin0Copy(pGVar4);
      Vec_IntPush(p_02,iVar6);
    }
    uVar2 = uVar2 + 1;
    if (p_02->nSize != iVar6) {
      __assert_fail("Vec_IntSize(vLayer) == Gia_ManCoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                    ,0x41b,"Vec_Wec_t *Gia_ManFindCofs(Gia_Man_t *, Vec_Int_t *, Gia_Man_t **)");
    }
  } while( true );
}

Assistant:

Vec_Wec_t * Gia_ManFindCofs( Gia_Man_t * p, Vec_Int_t * vRes, Gia_Man_t ** ppNew )
{
    Gia_Obj_t * pObj;
    Vec_Wec_t * vCofs = Vec_WecStart( 1 << Vec_IntSize(vRes) );
    int Value, i, m, nMints = 1 << Vec_IntSize(vRes);
    Gia_Man_t * pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    assert( Vec_IntSize(vRes) < Gia_ManCiNum(p) );
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    for ( m = 0; m < nMints; m++ )
    {
        Vec_Int_t * vLayer = Vec_WecEntry( vCofs, m );
        Vec_IntForEachEntry( vRes, Value, i )
            Gia_ManCi(p, Value)->Value = (unsigned)((m >> i) & 1);
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachCo( p, pObj, i )
            Vec_IntPush( vLayer, Gia_ObjFanin0Copy(pObj) );
        assert( Vec_IntSize(vLayer) == Gia_ManCoNum(p) );
        //printf( "%3d : ", m ); Vec_IntPrint( vLayer );
    }
    if ( ppNew != NULL )
        *ppNew = pNew;
    return vCofs;
}